

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::code_block(jpeg_encoder *this,int component_num)

{
  int in_ESI;
  jpeg_encoder *in_RDI;
  undefined4 in_stack_00000038;
  int in_stack_0000003c;
  jpeg_encoder *in_stack_00000040;
  
  DCT2D((int32 *)CONCAT44(in_stack_0000003c,in_stack_00000038));
  load_quantized_coefficients(in_RDI,in_ESI);
  if (in_RDI->m_pass_num == '\x01') {
    code_coefficients_pass_one(in_RDI,in_ESI);
  }
  else {
    code_coefficients_pass_two(in_stack_00000040,in_stack_0000003c);
  }
  return;
}

Assistant:

void jpeg_encoder::code_block(int component_num) {
  DCT2D(m_sample_array);
  load_quantized_coefficients(component_num);
  if (m_pass_num == 1)
    code_coefficients_pass_one(component_num);
  else
    code_coefficients_pass_two(component_num);
}